

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall vera::Scene::update(Scene *this)

{
  mapped_type *ppTVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  key_type local_38;
  
  if ((this->m_skybox).change == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"default","");
    ppTVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*>_>_>
              ::operator[](&this->cubemaps,&local_38);
    (*((*ppTVar1)->super_Texture)._vptr_Texture[0x10])
              (*ppTVar1,&this->m_skybox,(ulong)(uint)this->m_skyboxSize,(ulong)this->m_skyboxFlip);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    (this->m_skybox).change = false;
  }
  if (this->m_streamsPrevsChange == true) {
    this->m_streamsPrevsChange = false;
    for (p_Var2 = (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->streams)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 2) + 0x98))(*(long **)(p_Var2 + 2),this->m_streamsPrevs);
    }
  }
  for (p_Var2 = (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->streams)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(**(long **)(p_Var2 + 2) + 0x110))();
  }
  return;
}

Assistant:

void Scene::update() {
    if (m_skybox.change) {
        cubemaps["default"]->load(&m_skybox, m_skyboxSize, m_skyboxFlip);
        m_skybox.change = false;
    }

    if (m_streamsPrevsChange) {
        m_streamsPrevsChange = false;
        for (TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); it++)
            it->second->setPrevTextures(m_streamsPrevs);
    }

    for (TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it)
        it->second->update();
}